

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O0

void __thiscall Clipper::RemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  bool bVar1;
  ClipNode *local_20;
  ClipNode *node;
  angle_t end_local;
  angle_t start_local;
  Clipper *this_local;
  
  node._4_4_ = start;
  if (this->silhouette != (ClipNode *)0x0) {
    local_20 = this->silhouette;
    while( true ) {
      bVar1 = false;
      if (local_20 != (ClipNode *)0x0) {
        bVar1 = local_20->end <= start;
      }
      if (!bVar1) break;
      local_20 = local_20->next;
    }
    if ((local_20 != (ClipNode *)0x0) && (local_20->start <= start)) {
      if (end <= local_20->end) {
        return;
      }
      node._4_4_ = local_20->end;
      local_20 = local_20->next;
    }
    while( true ) {
      bVar1 = false;
      if (local_20 != (ClipNode *)0x0) {
        bVar1 = local_20->start < end;
      }
      if (!bVar1) break;
      DoRemoveClipRange(this,node._4_4_,local_20->start);
      node._4_4_ = local_20->end;
      local_20 = local_20->next;
    }
    if (end <= node._4_4_) {
      return;
    }
  }
  DoRemoveClipRange(this,node._4_4_,end);
  return;
}

Assistant:

void Clipper::RemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node;

	if (silhouette)
	{
		node = silhouette;
		while (node != NULL && node->end <= start)
		{
			node = node->next;
		}
		if (node != NULL && node->start <= start)
		{
			if (node->end >= end) return;
			start = node->end;
			node = node->next;
		}
		while (node != NULL && node->start < end)
		{
			DoRemoveClipRange(start, node->start);
			start = node->end;
			node = node->next;
		}
		if (start >= end) return;
	}
	DoRemoveClipRange(start, end);
}